

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O0

avl_node * avl_next(avl_node *node)

{
  avl_node *paVar1;
  avl_node *p;
  avl_node *node_local;
  avl_node *local_8;
  
  if (node == (avl_node *)0x0) {
    local_8 = (avl_node *)0x0;
  }
  else {
    p = node;
    if (node->right == (avl_node *)0x0) {
      if (((ulong)node->parent & 0xfffffffffffffffc) != 0) {
        paVar1 = node->parent;
        while (node_local = (avl_node *)((ulong)paVar1 & 0xfffffffffffffffc),
              node_local != (avl_node *)0x0) {
          if (node_local->left == p) {
            return node_local;
          }
          p = node_local;
          paVar1 = node_local->parent;
        }
      }
      local_8 = (avl_node *)0x0;
    }
    else {
      for (node_local = node->right; node_local != (avl_node *)0x0; node_local = node_local->left) {
        p = node_local;
      }
      local_8 = p;
    }
  }
  return local_8;
}

Assistant:

struct avl_node* avl_next(struct avl_node *node)
{
    if (node == NULL) return NULL;

#ifdef _AVL_NEXT_POINTER
    return node->next;
#else

    struct avl_node *p;

    // smallest value of right subtree
    if (node->right) {
        p = node;
        node = node->right;
        while (node) {
            p = node;
            node = node->left;
        }
        return p;
    }

    // node does not have right child
    if (avl_parent(node)) {
        // find first parent that has right child
        p = node;
        node = avl_parent(node);
        while(node) {
            if (node->left == p) {
                return node;
            }
            p = node;
            node = avl_parent(node);
        }
    }
#endif
    return NULL;
}